

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWcursor * glfwCreateStandardCursor(int shape)

{
  int iVar1;
  _GLFWcursor *cursor;
  _GLFWcursor *p_Stack_10;
  int shape_local;
  
  if (_glfwInitialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    p_Stack_10 = (_GLFWcursor *)0x0;
  }
  else if ((((shape == 0x36001) || (shape == 0x36002)) || (shape == 0x36003)) ||
          (((shape == 0x36004 || (shape == 0x36005)) || (shape == 0x36006)))) {
    p_Stack_10 = (_GLFWcursor *)calloc(1,0x10);
    p_Stack_10->next = _glfw.cursorListHead;
    _glfw.cursorListHead = p_Stack_10;
    iVar1 = _glfwPlatformCreateStandardCursor(p_Stack_10,shape);
    if (iVar1 == 0) {
      glfwDestroyCursor((GLFWcursor *)p_Stack_10);
      p_Stack_10 = (_GLFWcursor *)0x0;
    }
  }
  else {
    _glfwInputError(0x10003,"Invalid standard cursor %i",(ulong)(uint)shape);
    p_Stack_10 = (_GLFWcursor *)0x0;
  }
  return (GLFWcursor *)p_Stack_10;
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateStandardCursor(int shape)
{
    _GLFWcursor* cursor;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (shape != GLFW_ARROW_CURSOR &&
        shape != GLFW_IBEAM_CURSOR &&
        shape != GLFW_CROSSHAIR_CURSOR &&
        shape != GLFW_HAND_CURSOR &&
        shape != GLFW_HRESIZE_CURSOR &&
        shape != GLFW_VRESIZE_CURSOR)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid standard cursor %i", shape);
        return NULL;
    }

    cursor = calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfwPlatformCreateStandardCursor(cursor, shape))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}